

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

void receive_gui_job(void)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  ulong uStack_18748;
  size_t i;
  char *pointer;
  ssize_t read_len;
  size_t msg_len;
  char match_buffer [20];
  undefined1 auStack_18708 [8];
  char buffer [100000];
  int BUFFER_SIZE;
  pair<const_char_*,_int> messages [4];
  byte local_a [8];
  bool key_pressed [2];
  
  memset(local_a,0,2);
  memcpy(&stack0xffffffffffffffa8,&PTR_anon_var_dwarf_7493_001209a0,0x40);
  memset(&msg_len,0,0x14);
  read_len = 0;
  while ((sVar2 = recv(servers[1].socket,auStack_18708,100000,0), sVar2 != 0 ||
         (piVar3 = __errno_location(), *piVar3 == 0))) {
    for (i = (size_t)auStack_18708; i < auStack_18708 + sVar2; i = i + 1) {
      if ((*(char *)i != '\n') && ((ulong)read_len < 0x14)) {
        match_buffer[read_len + -8] = *(char *)i;
        read_len = read_len + 1;
      }
      if (((*(char *)i == '\n') && (10 < (ulong)read_len)) && ((ulong)read_len < 0x10)) {
        for (uStack_18748 = 0; uStack_18748 < 4; uStack_18748 = uStack_18748 + 1) {
          iVar1 = strncmp((char *)&msg_len,*(char **)&messages[uStack_18748 - 1].second,
                          (long)*(int *)&messages[uStack_18748].first);
          if (iVar1 == 0) {
            fprintf(_stderr,"GUI recv: %s\n",*(undefined8 *)&messages[uStack_18748 - 1].second);
            local_a[uStack_18748 >> 1] = (uStack_18748 & 1) != 0;
          }
        }
      }
      if (*(char *)i == '\n') {
        memset(&msg_len,0,0x14);
        read_len = 0;
      }
    }
    turn_direction = (local_a[0] & 1) - (local_a[1] & 1);
  }
  perror("Connection to GUI failed");
  exit(1);
}

Assistant:

void receive_gui_job()
{
	bool key_pressed[2] = { false, false };
	
	constexpr std::pair<const char*, int> messages[] = {
		std::make_pair("LEFT_KEY_UP", sizeof("LEFT_KEY_UP")),
		std::make_pair("LEFT_KEY_DOWN", sizeof("LEFT_KEY_DOWN")),
		std::make_pair("RIGHT_KEY_UP", sizeof("RIGHT_KEY_UP")),
		std::make_pair("RIGHT_KEY_DOWN", sizeof("RIGHT_KEY_DOWN"))
	};

	constexpr int BUFFER_SIZE = 100000;
	char buffer[BUFFER_SIZE];
	// Since proper messages are newline-separated and TCP operates on stream of data,
	// copy first 16 signs and match the message
	char match_buffer[20] = { 0 };
	size_t msg_len = 0;

	while (true)
	{
		ssize_t read_len = recv(gui_server.socket, buffer, BUFFER_SIZE, 0);
		if (read_len == 0 && errno != 0)
		{
			std::perror("Connection to GUI failed");
			std::exit(1); // TODO: Verify that client exits
		}

		const char* pointer = buffer;
		while (pointer < buffer + read_len)
		{
			if (*pointer != '\n' && msg_len < sizeof(match_buffer))
			{
				match_buffer[msg_len] = *pointer;
				msg_len++;
			}
			// End of message and current message length in valid range (to avoid needless checks), check for message
			if (*pointer == '\n' && msg_len >= sizeof("LEFT_KEY_UP") - 1 && msg_len <= sizeof("RIGHT_KEY_DOWN"))
			{
				for (size_t i = 0; i < sizeof(messages) / sizeof(messages[0]); ++i)
				{
					// Directly map messages to the keys and values (pair of LEFT/RIGHT and UP/DOWN)
					if (strncmp(match_buffer, messages[i].first, messages[i].second) == 0)
					{
						fprintf(stderr, "GUI recv: %s\n", messages[i].first);
						key_pressed[i / 2] = (i % 2);
					}
				}
			}
			// Reset matching buffer, since every valid message is separated by newlines
			if (*pointer == '\n')
			{
				memset(match_buffer, 0x00, sizeof(match_buffer));
				msg_len = 0;
			}
			pointer++;
		}
		// Update turn direction after change
		turn_direction = (1 * key_pressed[0]) + (-1 * key_pressed[1]);
	}
}